

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

char __thiscall smf::Options::getType(Options *this,string *optionName)

{
  char cVar1;
  int iVar2;
  
  iVar2 = getRegIndex(this,optionName);
  if (iVar2 < 0) {
    cVar1 = -1;
  }
  else {
    iVar2 = getRegIndex(this,optionName);
    cVar1 = (this->m_optionRegister).
            super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar2]->m_type;
  }
  return cVar1;
}

Assistant:

char Options::getType(const std::string& optionName) {
	int index = getRegIndex(optionName);
	if (index < 0) {
		return -1;
	} else {
		return m_optionRegister[getRegIndex(optionName)]->getType();
	}
}